

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.hpp
# Opt level: O3

unsigned_short
duckdb::AddOperatorOverflowCheck::Operation<unsigned_short,unsigned_short,unsigned_short>
          (unsigned_short left,unsigned_short right)

{
  uint uVar1;
  OutOfRangeException *this;
  PhysicalType type;
  undefined6 in_register_00000032;
  undefined6 in_register_0000003a;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  uVar1 = (int)CONCAT62(in_register_00000032,right) + (int)CONCAT62(in_register_0000003a,left);
  if (uVar1 < 0x10000) {
    return (unsigned_short)uVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"Overflow in addition of %s (%s + %s)!","");
  TypeIdToString_abi_cxx11_(&local_48,(duckdb *)0x4,type);
  NumericHelper::ToString<unsigned_short>(&local_68,left);
  NumericHelper::ToString<unsigned_short>(&local_88,right);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_a8,&local_48,&local_68,&local_88);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryAddOperator::Operation(left, right, result)) {
			throw OutOfRangeException("Overflow in addition of %s (%s + %s)!", TypeIdToString(GetTypeId<TA>()),
			                          NumericHelper::ToString(left), NumericHelper::ToString(right));
		}
		return result;
	}